

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool __thiscall AnyType::OutputFromType<VisibleString>(AnyType *this,ostream *os)

{
  size_t *this_00;
  bool bVar1;
  undefined1 local_50 [8];
  VisibleString t;
  
  this_00 = &t.super_DerBase.cbData;
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_50 = (undefined1  [8])&PTR_EncodedSize_00146cc0;
  t.super_DerBase.cbData = (size_t)&t.value._M_string_length;
  t.value._M_dataplus._M_p = (pointer)0x0;
  t.value._M_string_length._0_1_ = 0;
  bVar1 = ConvertToType<VisibleString>(this,(VisibleString *)local_50);
  if (bVar1) {
    std::operator<<(os,(string *)this_00);
  }
  std::__cxx11::string::~string((string *)this_00);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }